

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_crt_check_cn(mbedtls_x509_buf *name,char *cn,size_t cn_len)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  
  uVar2 = name->len;
  if (uVar2 == cn_len) {
    if (cn_len != 0) {
      sVar6 = 0;
      do {
        bVar1 = cn[sVar6];
        if ((bVar1 != name->p[sVar6]) &&
           (((name->p[sVar6] ^ bVar1) != 0x20 || (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))))
        goto LAB_0011e555;
        sVar6 = sVar6 + 1;
      } while (cn_len != sVar6);
    }
LAB_0011e551:
    iVar4 = 0;
  }
  else {
LAB_0011e555:
    sVar5 = strlen(cn);
    if ((2 < uVar2) && ((puVar3 = name->p, *puVar3 == '*' && (puVar3[1] == '.')))) {
      if (sVar5 != 0) {
        sVar7 = 0;
        do {
          if (cn[sVar7] == '.') goto LAB_0011e589;
          sVar7 = sVar7 + 1;
        } while (sVar5 != sVar7);
      }
      sVar7 = 0;
LAB_0011e589:
      if ((sVar7 != 0) && (sVar5 - sVar7 == uVar2 - 1)) {
        if (uVar2 == 1) goto LAB_0011e551;
        lVar8 = 0;
        while( true ) {
          bVar1 = puVar3[lVar8 + 1];
          if ((bVar1 != cn[lVar8 + sVar7]) &&
             (((byte)(cn[lVar8 + sVar7] ^ bVar1) != 0x20 || (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))
             ) break;
          lVar8 = lVar8 + 1;
          if (uVar2 - 1 == lVar8) {
            return 0;
          }
        }
      }
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int x509_crt_check_cn( const mbedtls_x509_buf *name,
                              const char *cn, size_t cn_len )
{
    /* try exact match */
    if( name->len == cn_len &&
        x509_memcasecmp( cn, name->p, cn_len ) == 0 )
    {
        return( 0 );
    }

    /* try wildcard match */
    if( x509_check_wildcard( cn, name ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}